

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void detectStreamReader(char *fileName,MPLSParser *mplsParser,bool isSubMode)

{
  undefined8 uVar1;
  ostream *poVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  DetectStreamRez streamInfo;
  uint local_104;
  string postfix;
  string descr;
  MPLSStreamInfo mplsStreamInfo;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mplsStreamInfo,fileName,(allocator<char> *)&postfix);
  METADemuxer::DetectStreamReader
            (&streamInfo,&readManager,(string *)&mplsStreamInfo,mplsParser == (MPLSParser *)0x0);
  std::__cxx11::string::~string((string *)&mplsStreamInfo);
  uVar3 = 0;
  do {
    uVar6 = (ulong)uVar3;
    if ((ulong)(((long)streamInfo.streams.
                       super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)streamInfo.streams.
                      super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0xa0) <= uVar6) {
      if (streamInfo.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
          super__Vector_impl_data._M_start !=
          streamInfo.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
          super__Vector_impl_data._M_finish || 0 < streamInfo.fileDurationNano) {
        poVar2 = std::operator<<((ostream *)&std::cout,"");
        std::endl<char,std::char_traits<char>>(poVar2);
        sLastMsg = true;
      }
      if (streamInfo.fileDurationNano != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Duration: ");
        floatToTime_abi_cxx11_
                  ((string *)&mplsStreamInfo,(double)streamInfo.fileDurationNano / 1000000000.0,'.')
        ;
        poVar2 = std::operator<<(poVar2,(string *)&mplsStreamInfo);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&mplsStreamInfo);
        sLastMsg = true;
      }
      lVar4 = 0;
      lVar5 = 0;
      for (uVar6 = 0;
          uVar6 < (ulong)(((long)streamInfo.chapters.
                                 super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)streamInfo.chapters.
                                super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x28); uVar6 = uVar6 + 1) {
        uVar1 = *(undefined8 *)
                 ((long)&(streamInfo.chapters.
                          super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
                          super__Vector_impl_data._M_start)->start + lVar5);
        if ((uVar6 / 5) * 5 + lVar4 == 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"");
          std::endl<char,std::char_traits<char>>(poVar2);
          sLastMsg = true;
          std::operator<<((ostream *)&std::cout,"Marks: ");
          sLastMsg = true;
        }
        auVar7._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar7._0_8_ = uVar1;
        auVar7._12_4_ = 0x45300000;
        floatToTime_abi_cxx11_
                  ((string *)&mplsStreamInfo,
                   ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1000000000.0,
                   '.');
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&mplsStreamInfo);
        std::operator<<(poVar2," ");
        std::__cxx11::string::~string((string *)&mplsStreamInfo);
        sLastMsg = true;
        lVar5 = lVar5 + 0x28;
        lVar4 = lVar4 + -1;
      }
      if ((streamInfo.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
           super__Vector_impl_data._M_start !=
           streamInfo.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
           super__Vector_impl_data._M_finish) || (0 < streamInfo.fileDurationNano)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"");
        std::endl<char,std::char_traits<char>>(poVar2);
        sLastMsg = true;
      }
      DetectStreamRez::~DetectStreamRez(&streamInfo);
      return;
    }
    if (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar6].trackID != 0) {
      if (uVar6 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"");
        std::endl<char,std::char_traits<char>>(poVar2);
        sLastMsg = true;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Track ID:    ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,streamInfo.streams.
                                 super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar6].trackID);
      std::endl<char,std::char_traits<char>>(poVar2);
      sLastMsg = true;
    }
    if (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar6].codecInfo.codecID == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t detect stream type");
      std::endl<char,std::char_traits<char>>(poVar2);
      sLastMsg = true;
    }
    else {
      if (mplsParser != (MPLSParser *)0x0) {
        MPLSParser::getStreamByPID
                  (&mplsStreamInfo,mplsParser,
                   streamInfo.streams.
                   super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6].trackID);
        if (mplsStreamInfo.super_M2TSStreamInfo.streamPID == 0) {
          if ((streamInfo.streams.
               super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6].codecInfo.codecID != 0xe) ||
             (mplsParser->isDependStreamExist == false)) {
            streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar6].unused = true;
          }
        }
        else if (mplsStreamInfo.super_M2TSStreamInfo.isSecondary == true) {
          streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6].isSecondary = true;
        }
        MPLSStreamInfo::~MPLSStreamInfo(&mplsStreamInfo);
      }
      postfix._M_dataplus._M_p = (pointer)&postfix.field_2;
      postfix._M_string_length = 0;
      postfix.field_2._M_local_buf[0] = '\0';
      if ((isSubMode) &&
         (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6].codecInfo.codecID == 0xc)) {
        std::__cxx11::string::assign((char *)&postfix);
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Stream type: ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &streamInfo.streams.
                                       super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar6].codecInfo.
                                       displayName);
      poVar2 = std::operator<<(poVar2,(string *)&postfix);
      std::endl<char,std::char_traits<char>>(poVar2);
      sLastMsg = true;
      if (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6].isSecondary == true) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Secondary: 1");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      sLastMsg = true;
      if (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6].unused == true) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Unselected: 1");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      sLastMsg = true;
      poVar2 = std::operator<<((ostream *)&std::cout,"Stream ID:   ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &streamInfo.streams.
                                       super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar6].codecInfo.
                                       programName);
      std::endl<char,std::char_traits<char>>(poVar2);
      sLastMsg = true;
      std::__cxx11::string::string
                ((string *)&descr,
                 (string *)
                 &streamInfo.streams.
                  super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6].streamDescr);
      if (((mplsParser != (MPLSParser *)0x0) &&
          (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar6].codecInfo.codecID == 0xc)) &&
         (mplsParser->isDependStreamExist == true)) {
        MPLSParser::getStreamByPID
                  (&mplsStreamInfo,mplsParser,
                   streamInfo.streams.
                   super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6].trackID);
        if (mplsStreamInfo.super_M2TSStreamInfo.streamPID < 0x1200) {
LAB_001a730c:
          std::__cxx11::string::append((char *)&descr);
        }
        else {
          if (mplsStreamInfo.offsetId == 0xff) {
            std::__cxx11::string::append((char *)&descr);
          }
          else {
            std::__cxx11::string::append((char *)&descr);
            local_104 = (uint)mplsStreamInfo.offsetId;
            int32ToStr_abi_cxx11_(&local_50,(int32_t *)&local_104);
            std::__cxx11::string::append((string *)&descr);
            std::__cxx11::string::~string((string *)&local_50);
          }
          if (mplsStreamInfo.isSSPG == true) {
            std::__cxx11::string::append((char *)&descr);
            std::__cxx11::string::append((char *)&descr);
            int32ToStr_abi_cxx11_(&local_50,(int32_t *)mplsStreamInfo.rightEye);
            std::__cxx11::string::append((string *)&descr);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::append((char *)&descr);
            std::__cxx11::string::append((char *)&descr);
            int32ToStr_abi_cxx11_(&local_50,(int32_t *)mplsStreamInfo.leftEye);
            std::__cxx11::string::append((string *)&descr);
            std::__cxx11::string::~string((string *)&local_50);
            goto LAB_001a730c;
          }
        }
        MPLSStreamInfo::~MPLSStreamInfo(&mplsStreamInfo);
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Stream info: ");
      poVar2 = std::operator<<(poVar2,(string *)&descr);
      std::endl<char,std::char_traits<char>>(poVar2);
      sLastMsg = true;
      poVar2 = std::operator<<((ostream *)&std::cout,"Stream lang: ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &streamInfo.streams.
                                       super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar6].lang);
      std::endl<char,std::char_traits<char>>(poVar2);
      sLastMsg = true;
      if (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6].delay != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Stream delay: ");
        poVar2 = std::ostream::_M_insert<long>((long)poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      sLastMsg = true;
      if (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6].multiSubStream == true) {
        poVar2 = std::operator<<((ostream *)&std::cout,"subTrack: ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,(streamInfo.streams.
                                    super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar6].codecInfo.
                                    codecID != 0xe) + 1);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      sLastMsg = true;
      std::__cxx11::string::~string((string *)&descr);
      std::__cxx11::string::~string((string *)&postfix);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void detectStreamReader(const char* fileName, MPLSParser* mplsParser, bool isSubMode)
{
    DetectStreamRez streamInfo = METADemuxer::DetectStreamReader(readManager, fileName, mplsParser == nullptr);
    vector<CheckStreamRez>& streams = streamInfo.streams;

    for (unsigned i = 0; i < streams.size(); i++)
    {
        if (streams[i].trackID != 0)
        {
            if (i > 0)
                LTRACE(LT_INFO, 2, "");
            LTRACE(LT_INFO, 2, "Track ID:    " << streams[i].trackID);
        }
        if (streams[i].codecInfo.codecID)
        {
            if (mplsParser)
            {
                MPLSStreamInfo mplsStreamInfo = mplsParser->getStreamByPID(streams[i].trackID);
                if (mplsStreamInfo.streamPID)
                {
                    if (mplsStreamInfo.isSecondary)
                        streams[i].isSecondary = true;
                }
                else
                {
                    if (!(streams[i].codecInfo.codecID == CODEC_V_MPEG4_H264_DEP && mplsParser->isDependStreamExist))
                        streams[i].unused = true;
                }
            }

            string postfix;
            if (isSubMode && streams[i].codecInfo.codecID == CODEC_S_PGS)
                postfix = " (depended view)";
            LTRACE(LT_INFO, 2, "Stream type: " << streams[i].codecInfo.displayName << postfix);
            if (streams[i].isSecondary)
                LTRACE(LT_INFO, 2, "Secondary: 1");
            if (streams[i].unused)
                LTRACE(LT_INFO, 2, "Unselected: 1");

            LTRACE(LT_INFO, 2, "Stream ID:   " << streams[i].codecInfo.programName);
            std::string descr = streams[i].streamDescr;
            if (streams[i].codecInfo.codecID == CODEC_S_PGS && mplsParser && mplsParser->isDependStreamExist)
            {
                // PG stream
                MPLSStreamInfo mplsStreamInfo = mplsParser->getStreamByPID(streams[i].trackID);
                int pgTrackNum = mplsStreamInfo.streamPID - 0x1200;
                if (pgTrackNum >= 0)
                {
                    if (mplsStreamInfo.offsetId != 0xff)
                    {
                        descr += "   3d-plane: ";
                        descr += int32ToStr(mplsStreamInfo.offsetId);
                    }
                    else
                    {
                        descr += "   3d-plane: undefined";
                    }
                    if (mplsStreamInfo.isSSPG)
                    {
                        descr += "   (stereo, right=";
                        descr += (mplsStreamInfo.rightEye->type == 2 ? "dep-view " : "");
                        descr += int32ToStr(mplsStreamInfo.rightEye->streamPID);
                        descr += ", left=";
                        descr += (mplsStreamInfo.leftEye->type == 2 ? "dep-view " : "");
                        descr += int32ToStr(mplsStreamInfo.leftEye->streamPID);
                        descr += ")";
                    }
                }
                else
                    descr += "   (disabled)";
            }
            LTRACE(LT_INFO, 2, "Stream info: " << descr);
            LTRACE(LT_INFO, 2, "Stream lang: " << streams[i].lang);
            if (streams[i].delay)
                LTRACE(LT_INFO, 2, "Stream delay: " << streams[i].delay);
            if (streams[i].multiSubStream)
                LTRACE(LT_INFO, 2, "subTrack: " << (streams[i].codecInfo.codecID == CODEC_V_MPEG4_H264_DEP ? 1 : 2));
        }
        else
            LTRACE(LT_INFO, 2, "Can't detect stream type");
    }

    AVChapters& chapters = streamInfo.chapters;
    if (!chapters.empty() || streamInfo.fileDurationNano > 0)
        LTRACE(LT_INFO, 2, "");
    if (streamInfo.fileDurationNano)
        LTRACE(LT_INFO, 2, "Duration: " << floatToTime((double)streamInfo.fileDurationNano / 1e9));
    for (size_t j = 0; j < chapters.size(); j++)
    {
        uint64_t time = chapters[j].start;
        if (j % 5 == 0)
        {
            LTRACE(LT_INFO, 2, "");
            LTRACE2(LT_INFO, "Marks: ")
        }
        LTRACE2(LT_INFO, floatToTime((double)time / 1e9) << " ")
    }
    if (!chapters.empty() || streamInfo.fileDurationNano > 0)
        LTRACE(LT_INFO, 2, "");
}